

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::average_node_to_cellcenter
               (MultiFab *cc,int dcomp,MultiFab *nd,int scomp,int ncomp,int ngrow)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  Box bx;
  MFIter mfi;
  int local_1b4;
  long local_198;
  long local_190;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::growntilebox(&local_12c,&local_90,ngrow);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&cc->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&nd->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < ncomp) {
        lVar10 = (long)local_12c.smallend.vect[1];
        lVar6 = (long)local_12c.smallend.vect[0] * 8;
        uVar5 = 0;
        local_198 = (long)scomp << 3;
        local_190 = (long)dcomp << 3;
        do {
          iVar1 = local_12c.smallend.vect[2];
          local_1b4 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              local_1b4 = local_1b4 + 1;
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                lVar11 = (long)local_110.begin.x;
                lVar14 = local_110.jstride * 8;
                lVar4 = (lVar10 - local_110.begin.y) * lVar14;
                lVar8 = (long)(local_1b4 - local_110.begin.z) * local_110.kstride * 8 +
                        local_110.nstride * local_198;
                lVar15 = ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride * 8 +
                         local_110.nstride * local_198;
                iVar9 = (local_12c.smallend.vect[1] + 1) - local_110.begin.y;
                lVar16 = (long)local_110.p + lVar8 + lVar4 + lVar11 * -8 + lVar6 + 8;
                lVar12 = (long)local_110.p + lVar4 + lVar15 + lVar11 * -8 + lVar6 + 8;
                lVar13 = (long)local_d0.p +
                         local_d0.nstride * local_190 +
                         (lVar10 - local_d0.begin.y) * local_d0.jstride * 8 +
                         ((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + lVar6;
                lVar4 = lVar10;
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar2 = iVar9 * lVar14 + lVar8 + lVar11 * -8 + lVar6;
                    lVar3 = iVar9 * lVar14 + lVar15 + lVar11 * -8 + lVar6;
                    lVar7 = 0;
                    do {
                      *(double *)(lVar13 + lVar7 * 8) =
                           (*(double *)(lVar12 + -8 + lVar7 * 8) + *(double *)(lVar12 + lVar7 * 8) +
                            *(double *)((long)local_110.p + lVar7 * 8 + lVar3) +
                            *(double *)((long)local_110.p + lVar7 * 8 + lVar3 + 8) +
                            *(double *)(lVar16 + -8 + lVar7 * 8) + *(double *)(lVar16 + lVar7 * 8) +
                            *(double *)((long)local_110.p + lVar7 * 8 + lVar2) +
                           *(double *)((long)local_110.p + lVar7 * 8 + lVar2 + 8)) * 0.125;
                      lVar7 = lVar7 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar7);
                  }
                  lVar4 = lVar4 + 1;
                  lVar16 = lVar16 + lVar14;
                  lVar12 = lVar12 + lVar14;
                  iVar9 = iVar9 + 1;
                  lVar13 = lVar13 + local_d0.jstride * 8;
                } while (local_12c.bigend.vect[1] + 1 != (int)lVar4);
              }
              bVar17 = iVar1 != local_12c.bigend.vect[2];
              iVar1 = iVar1 + 1;
            } while (bVar17);
          }
          uVar5 = uVar5 + 1;
          local_198 = local_198 + 8;
          local_190 = local_190 + 8;
        } while (uVar5 != (uint)ncomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_node_to_cellcenter (MultiFab& cc, int dcomp,
         const MultiFab& nd, int scomp, int ncomp, int ngrow)
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            auto const& ndma = nd.const_arrays();
            ParallelFor(cc, IntVect(ngrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avg_nd_to_cc(i, j, k, n, ccma[box_no], ndma[box_no], dcomp, scomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                Array4<Real const> const& ndarr = nd.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
                {
                    amrex_avg_nd_to_cc(i, j, k, n, ccarr, ndarr, dcomp, scomp);
                });
            }
        }
    }